

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckType(ScalarReplacementPass *this,Instruction *typeInst)

{
  bool bVar1;
  uint uVar2;
  uint32_t id;
  uint64_t uVar3;
  bool bVar4;
  
  bVar1 = CheckTypeAnnotations(this,typeInst);
  if (bVar1) {
    if (typeInst->opcode_ == OpTypeArray) {
      uVar2 = (typeInst->has_result_id_ & 1) + 1;
      if (typeInst->has_type_id_ == false) {
        uVar2 = (uint)typeInst->has_result_id_;
      }
      id = Instruction::GetSingleWordOperand(typeInst,uVar2 + 1);
      bVar1 = IsSpecConstant(this,id);
      if (!bVar1) {
        uVar3 = GetArrayLength(this,typeInst);
        bVar4 = (ulong)this->max_num_elements_ == 0;
        bVar1 = uVar3 <= this->max_num_elements_;
LAB_004f8bda:
        return (bool)(bVar1 | bVar4);
      }
    }
    else if (typeInst->opcode_ == OpTypeStruct) {
      uVar2 = (typeInst->has_result_id_ & 1) + 1;
      if (typeInst->has_type_id_ == false) {
        uVar2 = (uint)typeInst->has_result_id_;
      }
      uVar2 = (int)((ulong)((long)(typeInst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(typeInst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
              uVar2;
      if (uVar2 != 0) {
        bVar4 = this->max_num_elements_ == 0;
        bVar1 = uVar2 <= this->max_num_elements_;
        goto LAB_004f8bda;
      }
    }
  }
  return false;
}

Assistant:

bool ScalarReplacementPass::CheckType(const Instruction* typeInst) const {
  if (!CheckTypeAnnotations(typeInst)) {
    return false;
  }

  switch (typeInst->opcode()) {
    case spv::Op::OpTypeStruct:
      // Don't bother with empty structs or very large structs.
      if (typeInst->NumInOperands() == 0 ||
          IsLargerThanSizeLimit(typeInst->NumInOperands())) {
        return false;
      }
      return true;
    case spv::Op::OpTypeArray:
      if (IsSpecConstant(typeInst->GetSingleWordInOperand(1u))) {
        return false;
      }
      if (IsLargerThanSizeLimit(GetArrayLength(typeInst))) {
        return false;
      }
      return true;
      // TODO(alanbaker): Develop some heuristics for when this should be
      // re-enabled.
      //// Specifically including matrix and vector in an attempt to reduce the
      //// number of vector registers required.
      // case spv::Op::OpTypeMatrix:
      // case spv::Op::OpTypeVector:
      //  if (IsLargerThanSizeLimit(GetNumElements(typeInst))) return false;
      //  return true;

    case spv::Op::OpTypeRuntimeArray:
    default:
      return false;
  }
}